

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.h
# Opt level: O2

CScript * __thiscall CScript::push_int64(CScript *this,int64_t n)

{
  long in_FS_OFFSET;
  span<const_std::byte,_18446744073709551615UL> b;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  int64_t local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = n;
  if (n == -1 || n - 1U < 0x10) {
    local_38._M_impl.super__Vector_impl_data._M_start._0_1_ = (char)n + 'P';
  }
  else {
    if (n != 0) {
      CScriptNum::serialize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38,&local_20);
      b._M_extent._M_extent_value =
           (long)local_38._M_impl.super__Vector_impl_data._M_finish -
           (long)CONCAT71(local_38._M_impl.super__Vector_impl_data._M_start._1_7_,
                          (char)local_38._M_impl.super__Vector_impl_data._M_start);
      b._M_ptr = (pointer)CONCAT71(local_38._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   (char)local_38._M_impl.super__Vector_impl_data._M_start);
      operator<<(this,b);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
      goto LAB_002c7c62;
    }
    local_38._M_impl.super__Vector_impl_data._M_start._0_1_ = '\0';
  }
  prevector<28u,unsigned_char,unsigned_int,int>::emplace_back<unsigned_char_const&>
            ((prevector<28u,unsigned_char,unsigned_int,int> *)this,(uchar *)&local_38);
LAB_002c7c62:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

CScript& push_int64(int64_t n)
    {
        if (n == -1 || (n >= 1 && n <= 16))
        {
            push_back(n + (OP_1 - 1));
        }
        else if (n == 0)
        {
            push_back(OP_0);
        }
        else
        {
            *this << CScriptNum::serialize(n);
        }
        return *this;
    }